

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeDeleteAuxData(sqlite3 *db,AuxData **pp,int iOp,int mask)

{
  AuxData *p;
  AuxData *pAux;
  int mask_local;
  int iOp_local;
  AuxData **pp_local;
  sqlite3 *db_local;
  
  _mask_local = pp;
  while (*_mask_local != (AuxData *)0x0) {
    p = *_mask_local;
    if ((iOp < 0) ||
       (((p->iAuxOp == iOp && (-1 < p->iAuxArg)) &&
        ((0x1f < p->iAuxArg || ((mask & 1 << ((byte)p->iAuxArg & 0x1f)) == 0)))))) {
      if (p->xDeleteAux != (_func_void_void_ptr *)0x0) {
        (*p->xDeleteAux)(p->pAux);
      }
      *_mask_local = p->pNextAux;
      sqlite3DbFree(db,p);
    }
    else {
      _mask_local = &p->pNextAux;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDeleteAuxData(sqlite3 *db, AuxData **pp, int iOp, int mask){
  while( *pp ){
    AuxData *pAux = *pp;
    if( (iOp<0)
     || (pAux->iAuxOp==iOp
          && pAux->iAuxArg>=0
          && (pAux->iAuxArg>31 || !(mask & MASKBIT32(pAux->iAuxArg))))
    ){
      testcase( pAux->iAuxArg==31 );
      if( pAux->xDeleteAux ){
        pAux->xDeleteAux(pAux->pAux);
      }
      *pp = pAux->pNextAux;
      sqlite3DbFree(db, pAux);
    }else{
      pp= &pAux->pNextAux;
    }
  }
}